

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void add_substitution(bsdtar *bsdtar,char *rule_text)

{
  undefined8 *puVar1;
  int *piVar2;
  char *pcVar3;
  char *__pattern;
  void *pvVar4;
  char local_98 [8];
  char buf [80];
  int r;
  char *pattern;
  char *start_subst;
  char *end_pattern;
  substitution *subst;
  subst_rule *rule;
  char *rule_text_local;
  bsdtar *bsdtar_local;
  
  end_pattern = (char *)bsdtar->substitution;
  if ((substitution *)end_pattern == (substitution *)0x0) {
    init_substitution(bsdtar);
    end_pattern = (char *)bsdtar->substitution;
  }
  puVar1 = (undefined8 *)malloc(0x58);
  if (puVar1 == (undefined8 *)0x0) {
    piVar2 = __errno_location();
    lafe_errc(1,*piVar2,"Out of memory");
  }
  *puVar1 = 0;
  puVar1[9] = 0;
  if (*(long *)(end_pattern + 8) == 0) {
    *(undefined8 **)end_pattern = puVar1;
  }
  else {
    **(undefined8 **)(end_pattern + 8) = puVar1;
  }
  *(undefined8 **)(end_pattern + 8) = puVar1;
  if (*rule_text == '\0') {
    lafe_errc(1,0,"Empty replacement string");
  }
  pcVar3 = strchr(rule_text + 1,(int)*rule_text);
  if (pcVar3 == (char *)0x0) {
    lafe_errc(1,0,"Invalid replacement string");
  }
  __pattern = (char *)malloc((long)pcVar3 - (long)rule_text);
  if (__pattern != (char *)0x0) {
    memcpy(__pattern,rule_text + 1,(size_t)(pcVar3 + (-1 - (long)rule_text)));
    __pattern[(long)(pcVar3 + (-1 - (long)rule_text))] = '\0';
    buf._76_4_ = regcomp((regex_t *)(puVar1 + 1),__pattern,0);
    if (buf._76_4_ != 0) {
      regerror(buf._76_4_,(regex_t *)(puVar1 + 1),local_98,0x50);
      lafe_errc(1,0,"Invalid regular expression: %s",local_98);
    }
    free(__pattern);
    pcVar3 = pcVar3 + 1;
    start_subst = strchr(pcVar3,(int)*rule_text);
    if (start_subst != (char *)0x0) {
      pvVar4 = malloc((size_t)(start_subst + (1 - (long)pcVar3)));
      puVar1[9] = pvVar4;
      if (puVar1[9] != 0) {
        memcpy((void *)puVar1[9],pcVar3,(long)start_subst - (long)pcVar3);
        start_subst[puVar1[9] - (long)pcVar3] = '\0';
        *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfe;
        *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfd;
        *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfb | 4;
        *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xf7 | 8;
        *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xef | 0x10;
        *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xdf;
        while (pcVar3 = start_subst + 1, start_subst[1] != '\0') {
          start_subst = pcVar3;
          switch(*pcVar3) {
          case 'B':
          case 'b':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xdf | 0x20;
            break;
          default:
            lafe_errc(1,0,"Invalid replacement flag %c",(ulong)(uint)(int)*pcVar3);
          case 'G':
          case 'g':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfe | 1;
            break;
          case 'H':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xef;
            break;
          case 'P':
          case 'p':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfd | 2;
            break;
          case 'R':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfb;
            break;
          case 'S':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xf7;
            break;
          case 'h':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xef | 0x10;
            break;
          case 'r':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xfb | 4;
            break;
          case 's':
            *(byte *)(puVar1 + 10) = *(byte *)(puVar1 + 10) & 0xf7 | 8;
          }
        }
        return;
      }
      piVar2 = __errno_location();
      lafe_errc(1,*piVar2,"Out of memory");
    }
    lafe_errc(1,0,"Invalid replacement string");
  }
  piVar2 = __errno_location();
  lafe_errc(1,*piVar2,"Out of memory");
}

Assistant:

void
add_substitution(struct bsdtar *bsdtar, const char *rule_text)
{
	struct subst_rule *rule;
	struct substitution *subst;
	const char *end_pattern, *start_subst;
	char *pattern;
	int r;

	if ((subst = bsdtar->substitution) == NULL) {
		init_substitution(bsdtar);
		subst = bsdtar->substitution;
	}

	rule = malloc(sizeof(*rule));
	if (rule == NULL)
		lafe_errc(1, errno, "Out of memory");
	rule->next = NULL;
	rule->result = NULL;

	if (subst->last_rule == NULL)
		subst->first_rule = rule;
	else
		subst->last_rule->next = rule;
	subst->last_rule = rule;

	if (*rule_text == '\0')
		lafe_errc(1, 0, "Empty replacement string");
	end_pattern = strchr(rule_text + 1, *rule_text);
	if (end_pattern == NULL)
		lafe_errc(1, 0, "Invalid replacement string");

	pattern = malloc(end_pattern - rule_text);
	if (pattern == NULL)
		lafe_errc(1, errno, "Out of memory");
	memcpy(pattern, rule_text + 1, end_pattern - rule_text - 1);
	pattern[end_pattern - rule_text - 1] = '\0';

	if ((r = regcomp(&rule->re, pattern, REG_BASIC)) != 0) {
		char buf[80];
		regerror(r, &rule->re, buf, sizeof(buf));
		lafe_errc(1, 0, "Invalid regular expression: %s", buf);
	}
	free(pattern);

	start_subst = end_pattern + 1;
	end_pattern = strchr(start_subst, *rule_text);
	if (end_pattern == NULL)
		lafe_errc(1, 0, "Invalid replacement string");

	rule->result = malloc(end_pattern - start_subst + 1);
	if (rule->result == NULL)
		lafe_errc(1, errno, "Out of memory");
	memcpy(rule->result, start_subst, end_pattern - start_subst);
	rule->result[end_pattern - start_subst] = '\0';

	/* Defaults */
	rule->global = 0; /* Don't do multiple replacements. */
	rule->print = 0; /* Don't print. */
	rule->regular = 1; /* Rewrite regular filenames. */
	rule->symlink = 1; /* Rewrite symlink targets. */
	rule->hardlink = 1; /* Rewrite hardlink targets. */
	rule->from_begin = 0; /* Don't match from start. */

	while (*++end_pattern) {
		switch (*end_pattern) {
		case 'b':
		case 'B':
			rule->from_begin = 1;
			break;
		case 'g':
		case 'G':
			rule->global = 1;
			break;
		case 'h':
			rule->hardlink = 1;
			break;
		case 'H':
			rule->hardlink = 0;
			break;
		case 'p':
		case 'P':
			rule->print = 1;
			break;
		case 'r':
			rule->regular = 1;
			break;
		case 'R':
			rule->regular = 0;
			break;
		case 's':
			rule->symlink = 1;
			break;
		case 'S':
			rule->symlink = 0;
			break;
		default:
			lafe_errc(1, 0, "Invalid replacement flag %c", *end_pattern);
			/* NOTREACHED */
		}
	}
}